

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::Reflection::AddField<std::__cxx11::string>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  RepeatedPtrFieldBase *this_00;
  int iVar1;
  ArenaImpl *this_01;
  uint32 uVar2;
  Rep *pRVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int iVar5;
  
  uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_00 = (RepeatedPtrFieldBase *)
            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
  pRVar3 = *(Rep **)((long)&message[2].super_MessageLite._vptr_MessageLite + (ulong)uVar2);
  if (pRVar3 == (Rep *)0x0) {
    iVar5 = this_00->total_size_;
  }
  else {
    iVar1 = this_00->current_size_;
    iVar5 = pRVar3->allocated_size;
    if (iVar1 < iVar5) {
      this_00->current_size_ = iVar1 + 1;
      return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pRVar3->elements[iVar1];
    }
    if (iVar5 != this_00->total_size_) goto LAB_00360e8c;
  }
  internal::RepeatedPtrFieldBase::Reserve(this_00,iVar5 + 1);
  pRVar3 = this_00->rep_;
  iVar5 = pRVar3->allocated_size;
LAB_00360e8c:
  pRVar3->allocated_size = iVar5 + 1;
  this_01 = (ArenaImpl *)this_00->arena_;
  if (this_01 == (ArenaImpl *)0x0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
  }
  else {
    if (this_01[1].initial_block_ != (Block *)0x0) {
      Arena::OnArenaAllocation((Arena *)this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    }
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             internal::ArenaImpl::AllocateAlignedAndAddCleanup
                       (this_01,0x20,internal::arena_destruct_object<std::__cxx11::string>);
  }
  (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  iVar5 = this_00->current_size_;
  this_00->current_size_ = iVar5 + 1;
  this_00->rep_->elements[iVar5] = pbVar4;
  return pbVar4;
}

Assistant:

Type* Reflection::AddField(Message* message,
                           const FieldDescriptor* field) const {
  RepeatedPtrField<Type>* repeated =
      MutableRaw<RepeatedPtrField<Type> >(message, field);
  return repeated->Add();
}